

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation_tests.cpp
# Opt level: O0

void txreconciliation_tests::RegisterPeerTest_invoker(void)

{
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_FS_OFFSET;
  RegisterPeerTest t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1c8;
  std_string *in_stack_fffffffffffff1d0;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1d8;
  RegisterPeerTest *in_stack_fffffffffffff1e8;
  const_string *in_stack_fffffffffffff1f0;
  size_t in_stack_fffffffffffff1f8;
  const_string *in_stack_fffffffffffff200;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff208;
  unit_test_log_t *this_00;
  RegisterPeerTest *in_stack_fffffffffffff388;
  const_string local_c38 [25];
  undefined1 local_aa0 [408];
  undefined1 local_908 [408];
  undefined1 local_770 [1488];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [17])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [15])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  RegisterPeerTest::RegisterPeerTest(in_stack_fffffffffffff1e8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_770,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [17])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [16])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::unit_test::setup_conditional<txreconciliation_tests::RegisterPeerTest>
            ((RegisterPeerTest *)0xb930ae);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_908,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [17])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [13])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  RegisterPeerTest::test_method(in_stack_fffffffffffff388);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_aa0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [17])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [19])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::unit_test::teardown_conditional<txreconciliation_tests::RegisterPeerTest>
            ((RegisterPeerTest *)0xb932fe);
  this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  file = local_c38;
  memset(file,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  line_num = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  msg = boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [17])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [15])in_stack_fffffffffffff1d0);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (this_00,file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  RegisterPeerTest::~RegisterPeerTest((RegisterPeerTest *)in_stack_fffffffffffff1c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(RegisterPeerTest)
{
    TxReconciliationTracker tracker(TXRECONCILIATION_VERSION);
    const uint64_t salt = 0;

    // Prepare a peer for reconciliation.
    tracker.PreRegisterPeer(0);

    // Invalid version.
    BOOST_CHECK_EQUAL(tracker.RegisterPeer(/*peer_id=*/0, /*is_peer_inbound=*/true,
                                           /*peer_recon_version=*/0, salt),
                      ReconciliationRegisterResult::PROTOCOL_VIOLATION);

    // Valid registration (inbound and outbound peers).
    BOOST_REQUIRE(!tracker.IsPeerRegistered(0));
    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(0, true, 1, salt), ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(0));
    BOOST_REQUIRE(!tracker.IsPeerRegistered(1));
    tracker.PreRegisterPeer(1);
    BOOST_REQUIRE(tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(1));

    // Reconciliation version is higher than ours, should be able to register.
    BOOST_REQUIRE(!tracker.IsPeerRegistered(2));
    tracker.PreRegisterPeer(2);
    BOOST_REQUIRE(tracker.RegisterPeer(2, true, 2, salt) == ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(2));

    // Try registering for the second time.
    BOOST_REQUIRE(tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::ALREADY_REGISTERED);

    // Do not register if there were no pre-registration for the peer.
    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(100, true, 1, salt), ReconciliationRegisterResult::NOT_FOUND);
    BOOST_CHECK(!tracker.IsPeerRegistered(100));
}